

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall sznet::net::Connector::start(Connector *this)

{
  EventLoop *this_00;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this->m_connect = true;
  this_00 = this->m_loop;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = startInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  local_30 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
             ::_M_invoke;
  *(Connector **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void Connector::start()
{
	m_connect = true;
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&Connector::startInLoop, this));
}